

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::BP4Reader::InitBuffer
          (BP4Reader *this,TimePoint *timeoutInstant,Seconds *pollSeconds,Seconds *timeoutSeconds)

{
  string *IdxFileName;
  undefined8 *puVar1;
  BP4Deserializer *m_BP4Deserializer;
  TransportMan *this_00;
  Comm *this_01;
  _func_int *p_Var2;
  char cVar3;
  bool bVar4;
  size_t sVar5;
  uint64_t size;
  size_t __val;
  long *plVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  size_t sVar9;
  uint64_t uVar10;
  size_type *psVar11;
  char cVar12;
  ulong uVar13;
  undefined8 uVar14;
  ulong uVar15;
  BP4Reader *this_02;
  string __str_1;
  string __str;
  size_t newIdxSize;
  string __str_2;
  ulong *local_2a0;
  uint local_298;
  undefined4 uStack_294;
  ulong local_290 [2];
  ulong *local_280;
  uint local_278;
  undefined4 uStack_274;
  ulong local_270 [2];
  ulong *local_260;
  long local_258;
  ulong local_250;
  long lStack_248;
  ulong *local_240;
  long local_238;
  ulong local_230;
  long lStack_228;
  ulong *local_220;
  long local_218;
  ulong local_210;
  long lStack_208;
  unsigned_long local_200;
  ulong *local_1f8;
  uint local_1f0;
  undefined4 uStack_1ec;
  ulong local_1e8 [2];
  undefined8 *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 *local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 *local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  Seconds *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_200 = 0;
  m_BP4Deserializer = &this->m_BP4Deserializer;
  if (*(int *)((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 0x10 +
              (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) != 0) goto LAB_0044716c;
  local_138 = timeoutSeconds;
  sVar5 = transportman::TransportMan::GetFileSize(&this->m_MDIndexFileManager,0);
  if (sVar5 == 0) goto LAB_0044716c;
  p_Var2 = m_BP4Deserializer->_vptr_BP4Deserializer[-3];
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"allocating metadata index buffer, in call to BPFileReader Open",""
            );
  adios2::format::BufferSTL::Resize
            ((BufferSTL *)(p_Var2 + 0x38 + (long)&(m_BP4Deserializer->m_Minifooter).VersionTag),
             sVar5,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  transportman::TransportMan::ReadFile
            (&this->m_MDIndexFileManager,
             *(char **)((this->m_BP4Deserializer)._vptr_BP4Deserializer[-3] + 0x80 +
                       (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer),sVar5,0,0);
  IdxFileName = &(this->super_Engine).m_Name;
  size = MetadataExpectedMinFileSize(m_BP4Deserializer,IdxFileName,true);
  this_00 = &this->m_MDFileManager;
  do {
    this_02 = (BP4Reader *)this_00;
    __val = transportman::TransportMan::GetFileSize(this_00,0);
    if (size <= __val) {
      p_Var2 = m_BP4Deserializer->_vptr_BP4Deserializer[-4];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"allocating metadata buffer, in call to BP4Reader Open","");
      adios2::format::BufferSTL::Resize
                ((BufferSTL *)(&m_BP4Deserializer->field_0x88 + (long)p_Var2),size,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      transportman::TransportMan::ReadFile
                (this_00,*(char **)((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 200 +
                                   (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer),size,0,0)
      ;
      this->m_MDFileAlreadyReadSize = size;
      this->m_MDIndexFileAlreadyReadSize = sVar5;
      local_200 = sVar5;
      goto LAB_0044716c;
    }
    bVar4 = SleepOrQuit(this_02,timeoutInstant,pollSeconds);
  } while (bVar4);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Engine","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"BP4Reader","");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"InitBuffer","");
  std::operator+(&local_70,"File ",IdxFileName);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_260 = &local_250;
  puVar8 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar8) {
    local_250 = *puVar8;
    lStack_248 = plVar6[3];
  }
  else {
    local_250 = *puVar8;
    local_260 = (ulong *)*plVar6;
  }
  local_258 = plVar6[1];
  *plVar6 = (long)puVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_130,vsnprintf,0x148,"%f",SUB84(local_138->__r,0));
  uVar13 = 0xf;
  if (local_260 != &local_250) {
    uVar13 = local_250;
  }
  if (uVar13 < local_130._M_string_length + local_258) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      uVar14 = local_130.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_130._M_string_length + local_258) goto LAB_00447576;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_260);
  }
  else {
LAB_00447576:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_130._M_dataplus._M_p);
  }
  local_1d8 = &local_1c8;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_1c8 = *puVar1;
    uStack_1c0 = puVar7[3];
  }
  else {
    local_1c8 = *puVar1;
    local_1d8 = (undefined8 *)*puVar7;
  }
  local_1d0 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  local_240 = &local_230;
  puVar8 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar8) {
    local_230 = *puVar8;
    lStack_228 = plVar6[3];
  }
  else {
    local_230 = *puVar8;
    local_240 = (ulong *)*plVar6;
  }
  local_238 = plVar6[1];
  *plVar6 = (long)puVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  cVar12 = '\x01';
  if (9 < sVar5) {
    sVar9 = sVar5;
    cVar3 = '\x04';
    do {
      cVar12 = cVar3;
      if (sVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_004476ad;
      }
      if (sVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_004476ad;
      }
      if (sVar9 < 10000) goto LAB_004476ad;
      bVar4 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar3 = cVar12 + '\x04';
    } while (bVar4);
    cVar12 = cVar12 + '\x01';
  }
LAB_004476ad:
  local_280 = local_270;
  std::__cxx11::string::_M_construct((ulong)&local_280,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_280,local_278,sVar5);
  uVar13 = CONCAT44(uStack_274,local_278) + local_238;
  uVar15 = 0xf;
  if (local_240 != &local_230) {
    uVar15 = local_230;
  }
  if (uVar15 < uVar13) {
    uVar15 = 0xf;
    if (local_280 != local_270) {
      uVar15 = local_270[0];
    }
    if (uVar15 < uVar13) goto LAB_00447728;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,(ulong)local_240);
  }
  else {
LAB_00447728:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_280);
  }
  local_1b8 = &local_1a8;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_1a8 = *puVar1;
    uStack_1a0 = puVar7[3];
  }
  else {
    local_1a8 = *puVar1;
    local_1b8 = (undefined8 *)*puVar7;
  }
  local_1b0 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  local_220 = &local_210;
  puVar8 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar8) {
    local_210 = *puVar8;
    lStack_208 = plVar6[3];
  }
  else {
    local_210 = *puVar8;
    local_220 = (ulong *)*plVar6;
  }
  local_218 = plVar6[1];
  *plVar6 = (long)puVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  cVar12 = '\x01';
  if (9 < __val) {
    sVar5 = __val;
    cVar3 = '\x04';
    do {
      cVar12 = cVar3;
      if (sVar5 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_0044785c;
      }
      if (sVar5 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_0044785c;
      }
      if (sVar5 < 10000) goto LAB_0044785c;
      bVar4 = 99999 < sVar5;
      sVar5 = sVar5 / 10000;
      cVar3 = cVar12 + '\x04';
    } while (bVar4);
    cVar12 = cVar12 + '\x01';
  }
LAB_0044785c:
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct((ulong)&local_2a0,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2a0,local_298,__val);
  uVar13 = CONCAT44(uStack_294,local_298) + local_218;
  uVar15 = 0xf;
  if (local_220 != &local_210) {
    uVar15 = local_210;
  }
  if (uVar15 < uVar13) {
    uVar15 = 0xf;
    if (local_2a0 != local_290) {
      uVar15 = local_290[0];
    }
    if (uVar15 < uVar13) goto LAB_004478d7;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,(ulong)local_220);
  }
  else {
LAB_004478d7:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_2a0);
  }
  local_198 = &local_188;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_188 = *puVar1;
    uStack_180 = puVar7[3];
  }
  else {
    local_188 = *puVar1;
    local_198 = (undefined8 *)*puVar7;
  }
  local_190 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_198);
  puVar8 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar8) {
    local_148 = *puVar8;
    lStack_140 = plVar6[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *puVar8;
    local_158 = (ulong *)*plVar6;
  }
  local_150 = plVar6[1];
  *plVar6 = (long)puVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  cVar12 = '\x01';
  if (9 < size) {
    uVar10 = size;
    cVar3 = '\x04';
    do {
      cVar12 = cVar3;
      if (uVar10 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00447a12;
      }
      if (uVar10 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00447a12;
      }
      if (uVar10 < 10000) goto LAB_00447a12;
      bVar4 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar3 = cVar12 + '\x04';
    } while (bVar4);
    cVar12 = cVar12 + '\x01';
  }
LAB_00447a12:
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct((ulong)&local_1f8,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1f8,local_1f0,size);
  uVar13 = CONCAT44(uStack_1ec,local_1f0) + local_150;
  uVar15 = 0xf;
  if (local_158 != &local_148) {
    uVar15 = local_148;
  }
  if (uVar15 < uVar13) {
    uVar15 = 0xf;
    if (local_1f8 != local_1e8) {
      uVar15 = local_1e8[0];
    }
    if (uVar15 < uVar13) goto LAB_00447a9a;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_158);
  }
  else {
LAB_00447a9a:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_1f8);
  }
  local_178 = &local_168;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_168 = *puVar1;
    uStack_160 = puVar7[3];
  }
  else {
    local_168 = *puVar1;
    local_178 = (undefined8 *)*puVar7;
  }
  local_170 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_f0.field_2._M_allocated_capacity = *psVar11;
    local_f0.field_2._8_8_ = plVar6[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar11;
    local_f0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_f0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_90,&local_b0,&local_110,&local_f0,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_280 != local_270) {
    operator_delete(local_280);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
LAB_0044716c:
  this_01 = &(this->super_Engine).m_Comm;
  local_200 = helper::Comm::BroadcastValue<unsigned_long>(this_01,&local_200,0);
  if (local_200 != 0) {
    helper::Comm::BroadcastVector<char>
              (this_01,(vector<char,_std::allocator<char>_> *)
                       (&m_BP4Deserializer->field_0xc8 +
                       (long)(this->m_BP4Deserializer)._vptr_BP4Deserializer[-4]),0);
    helper::Comm::BroadcastVector<char>
              (this_01,(vector<char,_std::allocator<char>_> *)
                       ((this->m_BP4Deserializer)._vptr_BP4Deserializer[-3] + 0x28 +
                       (long)&(m_BP4Deserializer->m_DeferredVariablesMap)._M_t),0);
    adios2::format::BP4Deserializer::ParseMetadataIndex
              (m_BP4Deserializer,
               (BufferSTL *)
               ((this->m_BP4Deserializer)._vptr_BP4Deserializer[-3] + 0x38 +
               (long)&(m_BP4Deserializer->m_Minifooter).VersionTag),0,true,false);
    this->m_IdxHeaderParsed = true;
    sVar5 = adios2::format::BP4Deserializer::ParseMetadata
                      (m_BP4Deserializer,
                       (BufferSTL *)
                       (&m_BP4Deserializer->field_0x88 +
                       (long)(this->m_BP4Deserializer)._vptr_BP4Deserializer[-4]),
                       &this->super_Engine,true);
    this->m_MDFileProcessedSize = sVar5;
  }
  return;
}

Assistant:

void BP4Reader::InitBuffer(const TimePoint &timeoutInstant, const Seconds &pollSeconds,
                           const Seconds &timeoutSeconds)
{
    size_t newIdxSize = 0;
    // Put all metadata in buffer
    if (m_BP4Deserializer.m_RankMPI == 0)
    {
        /* Read metadata index table into memory */
        const size_t metadataIndexFileSize = m_MDIndexFileManager.GetFileSize(0);
        if (metadataIndexFileSize > 0)
        {
            m_BP4Deserializer.m_MetadataIndex.Resize(metadataIndexFileSize,
                                                     "allocating metadata index buffer, "
                                                     "in call to BPFileReader Open");
            m_MDIndexFileManager.ReadFile(m_BP4Deserializer.m_MetadataIndex.m_Buffer.data(),
                                          metadataIndexFileSize);

            /* Read metadata file into memory but first make sure
             * it has the content that the index table refers to */
            uint64_t expectedMinFileSize =
                MetadataExpectedMinFileSize(m_BP4Deserializer, m_Name, true);
            size_t fileSize = 0;
            do
            {
                fileSize = m_MDFileManager.GetFileSize(0);
                if (fileSize >= expectedMinFileSize)
                {
                    break;
                }
            } while (SleepOrQuit(timeoutInstant, pollSeconds));

            if (fileSize >= expectedMinFileSize)
            {
                m_BP4Deserializer.m_Metadata.Resize(
                    expectedMinFileSize, "allocating metadata buffer, in call to BP4Reader Open");

                m_MDFileManager.ReadFile(m_BP4Deserializer.m_Metadata.m_Buffer.data(),
                                         expectedMinFileSize);
                m_MDFileAlreadyReadSize = expectedMinFileSize;
                m_MDIndexFileAlreadyReadSize = metadataIndexFileSize;
                newIdxSize = metadataIndexFileSize;
            }
            else
            {
                helper::Throw<std::ios_base::failure>(
                    "Engine", "BP4Reader", "InitBuffer",
                    "File " + m_Name +
                        " was found with an index file but md.0 "
                        "has not contained enough data within "
                        "the specified timeout of " +
                        std::to_string(timeoutSeconds.count()) +
                        " seconds. index size = " + std::to_string(metadataIndexFileSize) +
                        " metadata size = " + std::to_string(fileSize) +
                        " expected size = " + std::to_string(expectedMinFileSize) +
                        ". One reason could be if the reader finds old data "
                        "while "
                        "the writer is creating the new files.");
            }
        }
    }

    newIdxSize = m_Comm.BroadcastValue(newIdxSize, 0);

    if (newIdxSize > 0)
    {
        // broadcast buffer to all ranks from zero
        m_Comm.BroadcastVector(m_BP4Deserializer.m_Metadata.m_Buffer);

        // broadcast metadata index buffer to all ranks from zero
        m_Comm.BroadcastVector(m_BP4Deserializer.m_MetadataIndex.m_Buffer);

        /* Parse metadata index table */
        m_BP4Deserializer.ParseMetadataIndex(m_BP4Deserializer.m_MetadataIndex, 0, true, false);
        // now we are sure the index header has been parsed, first step parsing
        // done
        m_IdxHeaderParsed = true;

        // fills IO with Variables and Attributes
        m_MDFileProcessedSize =
            m_BP4Deserializer.ParseMetadata(m_BP4Deserializer.m_Metadata, *this, true);

        /* m_MDFileProcessedSize is the position in the buffer where processing
         * ends. The processing is controlled by the number of records in the
         * Index, which may be less than the actual entries in the metadata in a
         * streaming situation (where writer has just written metadata for step
         * K+1,...,K+L while the index contains K steps when the reader looks at
         * it).
         *
         * In ProcessMetadataForNewSteps(), we will re-read the metadata which
         * is in the buffer but has not been processed yet.
         */
    }
}